

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_7::writeTileData
               (Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,uint64_t pixelDataSize,
               uint64_t unpackedDataSize,char *sampleCountTableData,uint64_t sampleCountTableSize)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t *puVar5;
  undefined4 in_ECX;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  ulong in_stack_00000008;
  undefined8 in_stack_00000018;
  uint64_t currentPosition;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  OStream *in_stack_ffffffffffffffc0;
  uint64_t uVar6;
  
  uVar4 = *(uint64_t *)(*(long *)(in_RDI + 0x1c0) + 0x30);
  *(undefined8 *)(*(long *)(in_RDI + 0x1c0) + 0x30) = 0;
  if (uVar4 == 0) {
    uVar4 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x1c0) + 0x28) + 0x18))();
  }
  uVar6 = uVar4;
  puVar5 = TileOffsets::operator()
                     ((TileOffsets *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                      (int)(uVar4 >> 0x20),(int)uVar4);
  *puVar5 = uVar4;
  if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  plVar1 = *(long **)(*(long *)(in_RDI + 0x1c0) + 0x28);
  (**(code **)(*plVar1 + 0x10))(plVar1,in_stack_00000018,currentPosition & 0xffffffff);
  plVar1 = *(long **)(*(long *)(in_RDI + 0x1c0) + 0x28);
  (**(code **)(*plVar1 + 0x10))(plVar1,in_R9,in_stack_00000008 & 0xffffffff);
  iVar2 = Xdr::size<int>();
  iVar3 = Xdr::size<unsigned_long>();
  *(uint64_t *)(*(long *)(in_RDI + 0x1c0) + 0x30) =
       uVar6 + (long)(iVar2 << 2) + (long)(iVar3 * 3) + currentPosition + in_stack_00000008;
  if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
    iVar2 = Xdr::size<int>();
    *(long *)(*(long *)(in_RDI + 0x1c0) + 0x30) =
         (long)iVar2 + *(long *)(*(long *)(in_RDI + 0x1c0) + 0x30);
  }
  return;
}

Assistant:

void
writeTileData (
    DeepTiledOutputFile::Data* ofd,
    int                        dx,
    int                        dy,
    int                        lx,
    int                        ly,
    const char                 pixelData[],
    uint64_t                   pixelDataSize,
    uint64_t                   unpackedDataSize,
    const char                 sampleCountTableData[],
    uint64_t                   sampleCountTableSize)
{

    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    uint64_t currentPosition          = ofd->_streamData->currentPosition;
    ofd->_streamData->currentPosition = 0;

    if (currentPosition == 0) currentPosition = ofd->_streamData->os->tellp ();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

#ifdef DEBUG
    assert (ofd->_streamData->os->tellp () == currentPosition);
#endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write<StreamIO> (*ofd->_streamData->os, ofd->partNumber);
    }
    Xdr::write<StreamIO> (*ofd->_streamData->os, dx);
    Xdr::write<StreamIO> (*ofd->_streamData->os, dy);
    Xdr::write<StreamIO> (*ofd->_streamData->os, lx);
    Xdr::write<StreamIO> (*ofd->_streamData->os, ly);

    //
    // Write the packed size of the pixel sample count table (64 bits)
    //

    Xdr::write<StreamIO> (*ofd->_streamData->os, sampleCountTableSize);

    //
    // Write the packed and unpacked data size (64 bits each)
    //

    Xdr::write<StreamIO> (*ofd->_streamData->os, pixelDataSize);
    Xdr::write<StreamIO> (*ofd->_streamData->os, unpackedDataSize);

    //
    // Write the compressed pixel sample count table.
    //

    ofd->_streamData->os->write (
        sampleCountTableData, static_cast<int> (sampleCountTableSize));

    //
    // Write the compressed data.
    //

    ofd->_streamData->os->write (pixelData, static_cast<int> (pixelDataSize));

    //
    // Keep current position in the file so that we can avoid
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    ofd->_streamData->currentPosition =
        currentPosition + 4 * Xdr::size<int> () + // dx, dy, lx, ly,
        3 * Xdr::size<uint64_t> () +              // sampleCountTableSize,
                                                  // pixelDataSize,
                                                  // unpackedDataSize
        sampleCountTableSize + pixelDataSize;

    if (ofd->multipart)
    {
        ofd->_streamData->currentPosition += Xdr::size<int> ();
    }
}